

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

int socketio_open(CONCRETE_IO_HANDLE socket_io,ON_IO_OPEN_COMPLETE on_io_open_complete,
                 void *on_io_open_complete_context,ON_BYTES_RECEIVED on_bytes_received,
                 void *on_bytes_received_context,ON_IO_ERROR on_io_error,void *on_io_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (socket_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x359;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010a2ac;
    pcVar4 = "Invalid argument: SOCKET_IO_INSTANCE is NULL";
    iVar3 = 0x358;
  }
  else {
    if (*(int *)((long)socket_io + 0x50) == 0) {
      if (*socket_io == -1) {
        lookup_address((SOCKET_IO_INSTANCE *)socket_io);
        if (*(int *)((long)socket_io + 0x50) == 2) {
          iVar1 = initiate_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010a2ac;
            pcVar4 = "lookup_address_and_connect_socket failed";
            iVar3 = 0x372;
            goto LAB_0010a1b0;
          }
          if (*(int *)((long)socket_io + 0x50) == 2) {
            iVar1 = wait_for_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
            if (iVar1 != 0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010a2ac;
              pcVar4 = "wait_for_socket_connection failed";
              iVar3 = 0x376;
              goto LAB_0010a1b0;
            }
          }
        }
        *(ON_BYTES_RECEIVED *)((long)socket_io + 8) = on_bytes_received;
        *(void **)((long)socket_io + 0x20) = on_bytes_received_context;
        *(ON_IO_ERROR *)((long)socket_io + 0x10) = on_io_error;
        *(void **)((long)socket_io + 0x28) = on_io_error_context;
        *(ON_IO_OPEN_COMPLETE *)((long)socket_io + 0x18) = on_io_open_complete;
        *(void **)((long)socket_io + 0x30) = on_io_open_complete_context;
      }
      else {
        *(void **)((long)socket_io + 0x20) = on_bytes_received_context;
        *(ON_BYTES_RECEIVED *)((long)socket_io + 8) = on_bytes_received;
        *(ON_IO_ERROR *)((long)socket_io + 0x10) = on_io_error;
        *(void **)((long)socket_io + 0x28) = on_io_error_context;
        *(undefined4 *)((long)socket_io + 0x50) = 2;
      }
      iVar1 = 0;
      goto LAB_0010a2ac;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x360;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010a2ac;
    pcVar4 = "Failure: socket state is not closed.";
    iVar3 = 0x35f;
  }
LAB_0010a1b0:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/socketio_berkeley.c"
            ,"socketio_open",iVar3,1,pcVar4);
LAB_0010a2ac:
  if ((on_io_open_complete != (ON_IO_OPEN_COMPLETE)0x0) && (*(int *)((long)socket_io + 0x50) != 1))
  {
    (*on_io_open_complete)(on_io_open_complete_context,IO_OPEN_ERROR - (iVar1 == 0));
  }
  return iVar1;
}

Assistant:

int socketio_open(CONCRETE_IO_HANDLE socket_io, ON_IO_OPEN_COMPLETE on_io_open_complete, void* on_io_open_complete_context, ON_BYTES_RECEIVED on_bytes_received, void* on_bytes_received_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    int result;

    SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
    if (socket_io == NULL)
    {
        LogError("Invalid argument: SOCKET_IO_INSTANCE is NULL");
        result = MU_FAILURE;
    }
    else
    {
        if (socket_io_instance->io_state != IO_STATE_CLOSED)
        {
            LogError("Failure: socket state is not closed.");
            result = MU_FAILURE;
        }
        else if (socket_io_instance->socket != INVALID_SOCKET)
        {
            // Opening an accepted socket
            socket_io_instance->on_bytes_received_context = on_bytes_received_context;
            socket_io_instance->on_bytes_received = on_bytes_received;
            socket_io_instance->on_io_error = on_io_error;
            socket_io_instance->on_io_error_context = on_io_error_context;

            socket_io_instance->io_state = IO_STATE_OPEN;

            result = 0;
        }
        else
        {
            if ((result = lookup_address_and_initiate_socket_connection(socket_io_instance)) != 0)
            {
                LogError("lookup_address_and_connect_socket failed");
            }
            else if ((socket_io_instance->io_state == IO_STATE_OPEN) && (result = wait_for_socket_connection(socket_io_instance)) != 0)
            {
                LogError("wait_for_socket_connection failed");
            } 
            else
            {
                socket_io_instance->on_bytes_received = on_bytes_received;
                socket_io_instance->on_bytes_received_context = on_bytes_received_context;

                socket_io_instance->on_io_error = on_io_error;
                socket_io_instance->on_io_error_context = on_io_error_context;

                socket_io_instance->on_io_open_complete = on_io_open_complete;
                socket_io_instance->on_io_open_complete_context = on_io_open_complete_context;
            }
        }
    }

    if (socket_io_instance->io_state != IO_STATE_OPENING)
    {
        if (on_io_open_complete != NULL)
        {
            on_io_open_complete(on_io_open_complete_context, result == 0 ? IO_OPEN_OK : IO_OPEN_ERROR);
        }
    }

    return result;
}